

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dreadtriple.c
# Opt level: O1

void dreadtriple(int *m,int *n,int_t *nonz,double **nzval,int_t **rowind,int_t **colptr)

{
  uint *puVar1;
  uint *puVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  double *pdVar6;
  int_t *piVar7;
  int *piVar8;
  bool bVar9;
  void *addr;
  int *addr_00;
  int *addr_01;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  char *__s;
  
  uVar12 = 0;
  __isoc99_scanf("%d%d");
  uVar4 = *n;
  *m = uVar4;
  printf("m %d, n %d, nonz %ld\n",(ulong)uVar4,(ulong)(uint)*n,(long)*nonz);
  dallocateA(*n,*nonz,nzval,rowind,colptr);
  pdVar6 = *nzval;
  piVar7 = *rowind;
  piVar8 = *colptr;
  addr = superlu_malloc((long)*nonz << 3);
  addr_00 = int32Malloc(*nonz);
  addr_01 = int32Malloc(*nonz);
  if (0 < *n) {
    lVar11 = 0;
    do {
      piVar8[lVar11] = 0;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *n);
  }
  if (0 < *nonz) {
    uVar12 = 0;
    bVar9 = false;
    do {
      puVar1 = (uint *)(addr_00 + uVar12);
      puVar2 = (uint *)(addr_01 + uVar12);
      puVar3 = (undefined8 *)((long)addr + uVar12 * 8);
      __isoc99_scanf("%d%d%lf\n",puVar1,puVar2,puVar3);
      if ((int)uVar12 == 0) {
        if (*addr_00 == 0) {
          bVar9 = true;
          __s = "triplet file: row/col indices are zero-based.";
        }
        else {
          __s = "triplet file: row/col indices are one-based.";
          if (*addr_01 == 0) {
            __s = "triplet file: row/col indices are zero-based.";
            bVar9 = true;
          }
        }
        puts(__s);
      }
      if (!bVar9) {
        *puVar1 = *puVar1 - 1;
        *puVar2 = *puVar2 - 1;
      }
      uVar4 = *puVar1;
      if (((int)uVar4 < 0) || (*m <= (int)uVar4)) {
LAB_00105b87:
        fprintf(_stderr,"nz %d, (%d, %d) = %e out of bound, removed\n",*puVar3,uVar12 & 0xffffffff,
                (ulong)uVar4,(ulong)*puVar2);
        exit(-1);
      }
      uVar5 = *puVar2;
      if (((long)(int)uVar5 < 0) || (*n <= (int)uVar5)) goto LAB_00105b87;
      piVar8[(int)uVar5] = piVar8[(int)uVar5] + 1;
      uVar12 = uVar12 + 1;
    } while ((int)uVar12 < *nonz);
  }
  *nonz = (int_t)uVar12;
  iVar13 = *piVar8;
  *piVar8 = 0;
  if (1 < *n) {
    iVar10 = 0;
    lVar11 = 1;
    do {
      iVar10 = iVar10 + iVar13;
      iVar13 = piVar8[lVar11];
      piVar8[lVar11] = iVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *n);
  }
  if (0 < *nonz) {
    lVar11 = 0;
    do {
      iVar13 = addr_01[lVar11];
      iVar10 = piVar8[iVar13];
      piVar7[iVar10] = addr_00[lVar11];
      pdVar6[iVar10] = *(double *)((long)addr + lVar11 * 8);
      piVar8[iVar13] = piVar8[iVar13] + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < *nonz);
  }
  if (0 < (long)*n) {
    lVar11 = (long)*n + 1;
    do {
      piVar8[lVar11 + -1] = piVar8[lVar11 + -2];
      lVar11 = lVar11 + -1;
    } while (1 < lVar11);
  }
  *piVar8 = 0;
  superlu_free(addr);
  superlu_free(addr_00);
  superlu_free(addr_01);
  return;
}

Assistant:

void
dreadtriple(int *m, int *n, int_t *nonz,
	    double **nzval, int_t **rowind, int_t **colptr)
{
/*
 * Output parameters
 * =================
 *   (a,asub,xa): asub[*] contains the row subscripts of nonzeros
 *	in columns of matrix A; a[*] the numerical values;
 *	row i of A is given by a[k],k=xa[i],...,xa[i+1]-1.
 *
 */
    int    j, k, jsize, nnz, nz;
    double *a, *val;
    int_t  *asub, *xa;
    int    *row, *col;
    int    zero_base = 0;

    /*  Matrix format:
     *    First line:  #rows, #cols, #non-zero
     *    Triplet in the rest of lines:
     *                 row, col, value
     */

#ifdef _LONGINT
    scanf("%d%lld", n, nonz);
#else
    scanf("%d%d", n, nonz);
#endif    
    *m = *n;
    printf("m %d, n %d, nonz %ld\n", *m, *n, (long) *nonz);
    dallocateA(*n, *nonz, nzval, rowind, colptr); /* Allocate storage */
    a    = *nzval;
    asub = *rowind;
    xa   = *colptr;

    val = (double *) SUPERLU_MALLOC(*nonz * sizeof(double));
    row = int32Malloc(*nonz);
    col = int32Malloc(*nonz);

    for (j = 0; j < *n; ++j) xa[j] = 0;

    /* Read into the triplet array from a file */
    for (nnz = 0, nz = 0; nnz < *nonz; ++nnz) {
    
	scanf("%d%d%lf\n", &row[nz], &col[nz], &val[nz]);

        if ( nnz == 0 ) { /* first nonzero */
	    if ( row[0] == 0 || col[0] == 0 ) {
		zero_base = 1;
		printf("triplet file: row/col indices are zero-based.\n");
	    } else
		printf("triplet file: row/col indices are one-based.\n");
        }

        if ( !zero_base ) { 
 	  /* Change to 0-based indexing. */
	  --row[nz];
	  --col[nz];
        }

	if (row[nz] < 0 || row[nz] >= *m || col[nz] < 0 || col[nz] >= *n
	    /*|| val[nz] == 0.*/) {
	    fprintf(stderr, "nz %d, (%d, %d) = %e out of bound, removed\n",
		    nz, row[nz], col[nz], val[nz]);
	    exit(-1);
	} else {
	    ++xa[col[nz]];
	    ++nz;
	}
    }

    *nonz = nz;

    /* Initialize the array of column pointers */
    k = 0;
    jsize = xa[0];
    xa[0] = 0;
    for (j = 1; j < *n; ++j) {
	k += jsize;
	jsize = xa[j];
	xa[j] = k;
    }
    
    /* Copy the triplets into the column oriented storage */
    for (nz = 0; nz < *nonz; ++nz) {
	j = col[nz];
	k = xa[j];
	asub[k] = row[nz];
	a[k] = val[nz];
	++xa[j];
    }

    /* Reset the column pointers to the beginning of each column */
    for (j = *n; j > 0; --j)
	xa[j] = xa[j-1];
    xa[0] = 0;

    SUPERLU_FREE(val);
    SUPERLU_FREE(row);
    SUPERLU_FREE(col);

#ifdef CHK_INPUT
    {
	int i;
	for (i = 0; i < *n; i++) {
	    printf("Col %d, xa %d\n", i, xa[i]);
	    for (k = xa[i]; k < xa[i+1]; k++)
		printf("%d\t%16.10f\n", asub[k], a[k]);
	}
    }
#endif

}